

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusintegrator.cpp
# Opt level: O0

QDBusMetaObject * __thiscall
QDBusConnectionPrivate::findMetaObject
          (QDBusConnectionPrivate *this,QString *service,QString *path,QString *interface,
          QDBusError *error)

{
  bool bVar1;
  MessageType MVar2;
  ErrorType EVar3;
  QDBusMetaObject *pQVar4;
  QDBusWriteLocker *in_RDX;
  QDBusError *in_RSI;
  QDBusError *in_RDI;
  QDBusError *in_R8;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QDBusMetaObject *result;
  QDBusMetaObject *mo;
  QDBusMetaObject *mo_1;
  char16_t *str;
  QString xml;
  QDBusMessage reply;
  QDBusMessage msg;
  QDBusWriteLocker locker;
  QDBusReadLocker locker_1;
  QDBusError *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  byte in_stack_fffffffffffffdd7;
  QString *in_stack_fffffffffffffdd8;
  QDBusReadLocker *in_stack_fffffffffffffde0;
  QString *in_stack_fffffffffffffdf0;
  QString *in_stack_fffffffffffffdf8;
  QDBusConnectionPrivate *in_stack_fffffffffffffe00;
  QDBusMetaObject *local_1b8;
  QDBusError *in_stack_fffffffffffffe90;
  QHash<QString,_QDBusMetaObject_*> *in_stack_fffffffffffffe98;
  QString *in_stack_fffffffffffffea0;
  QString *in_stack_fffffffffffffea8;
  QDBusMessage local_e0;
  QArrayDataPointer<char16_t> local_d8 [3];
  QDBusMessage local_90 [12];
  undefined8 local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x170209);
  if (!bVar1) {
    local_18 = &DAT_aaaaaaaaaaaaaaaa;
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    QDBusReadLocker::QDBusReadLocker
              (in_stack_fffffffffffffde0,(ThreadAction)((ulong)in_stack_fffffffffffffdd8 >> 0x20),
               (QDBusConnectionPrivate *)
               CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    local_30 = 0;
    pQVar4 = QHash<QString,_QDBusMetaObject_*>::value
                       ((QHash<QString,_QDBusMetaObject_*> *)in_stack_fffffffffffffdd8,
                        (QString *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                        (QDBusMetaObject **)in_stack_fffffffffffffdc8);
    if (pQVar4 != (QDBusMetaObject *)0x0) {
      local_1b8 = pQVar4;
    }
    QDBusReadLocker::~QDBusReadLocker
              ((QDBusReadLocker *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    if (pQVar4 != (QDBusMetaObject *)0x0) goto LAB_00170759;
  }
  bVar1 = QString::isEmpty((QString *)0x1702c4);
  if (bVar1) {
    latin1 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)in_stack_fffffffffffffdd8,
                        CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    QString::QString((QString *)in_stack_fffffffffffffde0,latin1);
    QDBusError::QDBusError
              (in_RDI,(ErrorType)((ulong)in_stack_fffffffffffffde0 >> 0x20),
               in_stack_fffffffffffffdd8);
    QDBusError::operator=
              ((QDBusError *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8);
    QDBusError::~QDBusError
              ((QDBusError *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
    QString::~QString((QString *)0x170345);
    QDBusError::operator=
              ((QDBusError *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8);
    local_1b8 = (QDBusMetaObject *)0x0;
    goto LAB_00170759;
  }
  local_90[0].d_ptr = (QDBusMessagePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QDBusUtil::dbusInterfaceIntrospectable();
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_d8,(Data *)0x0,L"Introspect",10);
  QString::QString((QString *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                   (DataPointer *)in_stack_fffffffffffffdc8);
  QDBusMessage::createMethodCall
            (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,(QString *)in_RDI,(QString *)in_RDX
            );
  QString::~QString((QString *)0x170432);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)
             CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
  QString::~QString((QString *)0x17044c);
  QDBusMessagePrivate::setParametersValidated(local_90,true);
  local_e0.d_ptr = (QDBusMessagePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  sendWithReply(in_stack_fffffffffffffe00,(QDBusMessage *)in_stack_fffffffffffffdf8,
                (CallMode)((ulong)in_stack_fffffffffffffdf0 >> 0x20),(int)in_stack_fffffffffffffdf0)
  ;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QDBusWriteLocker::QDBusWriteLocker
            (in_RDX,(ThreadAction)((ulong)in_RSI >> 0x20),
             (QDBusConnectionPrivate *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0)
            );
  local_1b8 = (QDBusMetaObject *)0x0;
  bVar1 = QString::isEmpty((QString *)0x1704da);
  if (!bVar1) {
    local_1b8 = QHash<QString,_QDBusMetaObject_*>::value
                          ((QHash<QString,_QDBusMetaObject_*> *)in_RSI,
                           (QString *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                           (QDBusMetaObject **)in_stack_fffffffffffffdc8);
  }
  if (local_1b8 == (QDBusMetaObject *)0x0) {
    QString::QString((QString *)0x170569);
    MVar2 = QDBusMessage::type(&local_e0);
    if (MVar2 == ReplyMessage) {
      QDBusMessage::signature((QDBusMessage *)in_stack_fffffffffffffdc8);
      Qt::Literals::StringLiterals::operator____L1
                ((char *)in_RSI,CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      in_stack_fffffffffffffdd7 =
           ::operator==((QString *)in_RSI,
                        (QLatin1StringView *)
                        CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      QString::~QString((QString *)0x1705db);
      if ((in_stack_fffffffffffffdd7 & 1) != 0) {
        QDBusMessage::arguments((QDBusMessage *)in_stack_fffffffffffffdc8);
        QList<QVariant>::at((QList<QVariant> *)
                            CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                            (qsizetype)in_stack_fffffffffffffdc8);
        QVariant::toString();
        QString::operator=((QString *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                           (QString *)in_stack_fffffffffffffdc8);
        QString::~QString((QString *)0x17063d);
        QList<QVariant>::~QList((QList<QVariant> *)0x17064a);
      }
LAB_001706d2:
      local_1b8 = QDBusMetaObject::createMetaObject
                            (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                             in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
      QDBusError::operator=
                ((QDBusError *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdc8);
    }
    else {
      QDBusError::QDBusError
                (in_RSI,(QDBusMessage *)
                        CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      QDBusError::operator=
                ((QDBusError *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdc8);
      QDBusError::~QDBusError
                ((QDBusError *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
      QDBusError::operator=
                ((QDBusError *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 in_stack_fffffffffffffdc8);
      MVar2 = QDBusMessage::type(&local_e0);
      if ((MVar2 == ErrorMessage) && (EVar3 = QDBusError::type(in_R8), EVar3 == UnknownMethod))
      goto LAB_001706d2;
      local_1b8 = (QDBusMetaObject *)0x0;
    }
    QString::~QString((QString *)0x170732);
  }
  QDBusWriteLocker::~QDBusWriteLocker
            ((QDBusWriteLocker *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
  QDBusMessage::~QDBusMessage
            ((QDBusMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
  QDBusMessage::~QDBusMessage
            ((QDBusMessage *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0));
LAB_00170759:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1b8;
}

Assistant:

QDBusMetaObject *
QDBusConnectionPrivate::findMetaObject(const QString &service, const QString &path,
                                       const QString &interface, QDBusError &error)
{
    // service must be a unique connection name
    if (!interface.isEmpty()) {
        QDBusReadLocker locker(FindMetaObject1Action, this);
        QDBusMetaObject *mo = cachedMetaObjects.value(interface, nullptr);
        if (mo)
            return mo;
    }
    if (path.isEmpty()) {
        error = QDBusError(QDBusError::InvalidObjectPath, "Object path cannot be empty"_L1);
        lastError = error;
        return nullptr;
    }

    // introspect the target object
    QDBusMessage msg = QDBusMessage::createMethodCall(service, path,
                                                QDBusUtil::dbusInterfaceIntrospectable(),
                                                QStringLiteral("Introspect"));
    QDBusMessagePrivate::setParametersValidated(msg, true);

    QDBusMessage reply = sendWithReply(msg, QDBus::Block);

    // it doesn't exist yet, we have to create it
    QDBusWriteLocker locker(FindMetaObject2Action, this);
    QDBusMetaObject *mo = nullptr;
    if (!interface.isEmpty())
        mo = cachedMetaObjects.value(interface, nullptr);
    if (mo)
        // maybe it got created when we switched from read to write lock
        return mo;

    QString xml;
    if (reply.type() == QDBusMessage::ReplyMessage) {
        if (reply.signature() == "s"_L1)
            // fetch the XML description
            xml = reply.arguments().at(0).toString();
    } else {
        error = QDBusError(reply);
        lastError = error;
        if (reply.type() != QDBusMessage::ErrorMessage || error.type() != QDBusError::UnknownMethod)
            return nullptr; // error
    }

    // release the lock and return
    QDBusMetaObject *result = QDBusMetaObject::createMetaObject(interface, xml,
                                                                cachedMetaObjects, error);
    lastError = error;
    return result;
}